

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodelserialiser.cpp
# Opt level: O0

void __thiscall
XmlModelSerialiserPrivate::writeXmlElement
          (XmlModelSerialiserPrivate *this,QXmlStreamWriter *destination,QModelIndex *parent)

{
  QAbstractItemModel *pQVar1;
  QAbstractItemModel *pQVar2;
  QModelIndex *pQVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  ulong uVar9;
  QModelIndex local_3e8;
  undefined1 local_3d0 [24];
  QString local_3b8;
  QArrayDataPointer<char16_t> local_3a0;
  QString local_388;
  QString local_370;
  QArrayDataPointer<char16_t> local_358;
  QString local_340;
  QArrayDataPointer<char16_t> local_328;
  QString local_310;
  undefined1 local_2f8 [8];
  QString roleString;
  QModelIndex local_2d8;
  undefined1 local_2c0 [8];
  QVariant roleData;
  const_iterator local_298;
  const_iterator singleRole;
  QArrayDataPointer<char16_t> local_278;
  QString local_260;
  QString local_248;
  QArrayDataPointer<char16_t> local_230;
  QString local_218;
  QArrayDataPointer<char16_t> local_200;
  QString local_1e8;
  int local_1d0;
  int local_1cc;
  int j;
  int i;
  QArrayDataPointer<char16_t> local_1b0;
  QString local_198;
  QString local_180;
  QArrayDataPointer<char16_t> local_168;
  QString local_150;
  QArrayDataPointer<char16_t> local_128;
  QString local_110;
  QModelIndex *local_f8;
  QModelIndex *parent_local;
  QXmlStreamWriter *destination_local;
  XmlModelSerialiserPrivate *this_local;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_d0;
  char16_t *local_c8;
  char16_t *str_1;
  QArrayDataPointer<char16_t> *local_b8;
  char16_t *local_b0;
  char16_t *str_2;
  QArrayDataPointer<char16_t> *local_a0;
  char16_t *local_98;
  char16_t *str_8;
  QArrayDataPointer<char16_t> *local_88;
  char16_t *local_80;
  char16_t *str_7;
  QArrayDataPointer<char16_t> *local_70;
  char16_t *local_68;
  char16_t *str_3;
  QArrayDataPointer<char16_t> *local_58;
  char16_t *local_50;
  char16_t *str_4;
  QArrayDataPointer<char16_t> *local_40;
  char16_t *local_38;
  char16_t *str_5;
  QArrayDataPointer<char16_t> *local_28;
  char16_t *local_20;
  char16_t *str_6;
  QArrayDataPointer<char16_t> *local_10;
  
  pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
           m_constModel;
  local_f8 = parent;
  parent_local = (QModelIndex *)destination;
  destination_local = (QXmlStreamWriter *)this;
  iVar6 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,parent);
  pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
           m_constModel;
  iVar7 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,local_f8);
  pQVar3 = parent_local;
  if (iVar6 + iVar7 != 0) {
    str = L"Element";
    this_local = (XmlModelSerialiserPrivate *)anon_var_dwarf_9d6ab;
    local_d0 = &local_128;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_128,(Data *)0x0,L"Element",7);
    QString::QString(&local_110,&local_128);
    QXmlStreamWriter::writeStartElement((QString *)pQVar3);
    QString::~QString(&local_110);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
    pQVar3 = parent_local;
    str_1 = L"RowCount";
    local_c8 = L"RowCount";
    local_b8 = &local_168;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_168,(Data *)0x0,L"RowCount",8);
    QString::QString(&local_150,&local_168);
    pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_constModel;
    iVar6 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,local_f8);
    QString::number((int)&local_180,iVar6);
    QXmlStreamWriter::writeAttribute((QString *)pQVar3,(QString *)&local_150);
    QString::~QString(&local_180);
    QString::~QString(&local_150);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
    pQVar3 = parent_local;
    str_2 = L"ColumnCount";
    local_b0 = L"ColumnCount";
    local_a0 = &local_1b0;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_1b0,(Data *)0x0,L"ColumnCount",0xb);
    QString::QString(&local_198,&local_1b0);
    pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_constModel;
    iVar6 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,local_f8);
    QString::number((int)&j,iVar6);
    QXmlStreamWriter::writeAttribute((QString *)pQVar3,(QString *)&local_198);
    QString::~QString((QString *)&j);
    QString::~QString(&local_198);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b0);
    for (local_1cc = 0; iVar6 = local_1cc,
        pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
                 m_constModel, iVar7 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,local_f8),
        iVar6 < iVar7; local_1cc = local_1cc + 1) {
      for (local_1d0 = 0; iVar6 = local_1d0,
          pQVar1 = (this->super_AbstractStringSerialiserPrivate).
                   super_AbstractModelSerialiserPrivate.m_constModel,
          iVar7 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,local_f8), pQVar3 = parent_local,
          iVar6 < iVar7; local_1d0 = local_1d0 + 1) {
        str_3 = L"Cell";
        local_68 = L"Cell";
        local_58 = &local_200;
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_200,(Data *)0x0,L"Cell",4);
        QString::QString(&local_1e8,&local_200);
        QXmlStreamWriter::writeStartElement((QString *)pQVar3);
        QString::~QString(&local_1e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_200);
        pQVar3 = parent_local;
        str_4 = L"Row";
        local_50 = L"Row";
        local_40 = &local_230;
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_230,(Data *)0x0,L"Row",3);
        QString::QString(&local_218,&local_230);
        QXmlStreamWriter::writeStartElement((QString *)pQVar3);
        QString::~QString(&local_218);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_230);
        pQVar3 = parent_local;
        QString::number((int)&local_248,local_1cc);
        QXmlStreamWriter::writeCharacters((QString *)pQVar3);
        QString::~QString(&local_248);
        QXmlStreamWriter::writeEndElement();
        pQVar3 = parent_local;
        str_5 = L"Column";
        local_38 = L"Column";
        local_28 = &local_278;
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_278,(Data *)0x0,L"Column",6);
        QString::QString(&local_260,&local_278);
        QXmlStreamWriter::writeStartElement((QString *)pQVar3);
        QString::~QString(&local_260);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_278);
        pQVar3 = parent_local;
        QString::number((int)&singleRole,local_1d0);
        QXmlStreamWriter::writeCharacters((QString *)pQVar3);
        QString::~QString((QString *)&singleRole);
        QXmlStreamWriter::writeEndElement();
        local_298 = QList<int>::constBegin
                              (&(this->super_AbstractStringSerialiserPrivate).
                                super_AbstractModelSerialiserPrivate.m_rolesToSave);
        while( true ) {
          roleData.d._24_8_ =
               QList<int>::constEnd
                         (&(this->super_AbstractStringSerialiserPrivate).
                           super_AbstractModelSerialiserPrivate.m_rolesToSave);
          bVar4 = QList<int>::const_iterator::operator!=
                            (&local_298,(const_iterator)roleData.d._24_8_);
          if (!bVar4) break;
          pQVar1 = (this->super_AbstractStringSerialiserPrivate).
                   super_AbstractModelSerialiserPrivate.m_constModel;
          (**(code **)(*(long *)pQVar1 + 0x60))(&local_2d8,pQVar1,local_1cc,local_1d0,local_f8);
          piVar8 = QList<int>::const_iterator::operator*(&local_298);
          QModelIndex::data((QVariant *)local_2c0,&local_2d8,*piVar8);
          bVar5 = ::QVariant::isNull();
          if ((bVar5 & 1) == 0) {
            AbstractStringSerialiserPrivate::saveVariant
                      ((QString *)local_2f8,&this->super_AbstractStringSerialiserPrivate,
                       (QVariant *)local_2c0);
            bVar4 = QString::isEmpty((QString *)local_2f8);
            pQVar3 = parent_local;
            if (bVar4) {
              roleString.d.size._4_4_ = 10;
            }
            else {
              local_10 = &local_328;
              str_6 = L"DataPoint";
              local_20 = L"DataPoint";
              QArrayDataPointer<char16_t>::QArrayDataPointer(&local_328,(Data *)0x0,L"DataPoint",9);
              QString::QString(&local_310,&local_328);
              QXmlStreamWriter::writeStartElement((QString *)pQVar3);
              QString::~QString(&local_310);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_328);
              pQVar3 = parent_local;
              local_70 = &local_358;
              str_7 = L"Role";
              local_80 = L"Role";
              QArrayDataPointer<char16_t>::QArrayDataPointer(&local_358,(Data *)0x0,L"Role",4);
              QString::QString(&local_340,&local_358);
              piVar8 = QList<int>::const_iterator::operator*(&local_298);
              QString::number((int)&local_370,*piVar8);
              QXmlStreamWriter::writeAttribute((QString *)pQVar3,(QString *)&local_340);
              QString::~QString(&local_370);
              QString::~QString(&local_340);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_358);
              pQVar3 = parent_local;
              local_88 = &local_3a0;
              str_8 = L"Type";
              local_98 = L"Type";
              QArrayDataPointer<char16_t>::QArrayDataPointer(&local_3a0,(Data *)0x0,L"Type",4);
              QString::QString(&local_388,&local_3a0);
              iVar6 = ::QVariant::userType((QVariant *)local_2c0);
              QString::number((int)&local_3b8,iVar6);
              QXmlStreamWriter::writeAttribute((QString *)pQVar3,(QString *)&local_388);
              QString::~QString(&local_3b8);
              QString::~QString(&local_388);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3a0);
              QXmlStreamWriter::writeCharacters((QString *)parent_local);
              QXmlStreamWriter::writeEndElement();
              roleString.d.size._4_4_ = 0;
            }
            QString::~QString((QString *)local_2f8);
          }
          else {
            roleString.d.size._4_4_ = 10;
          }
          ::QVariant::~QVariant((QVariant *)local_2c0);
          QList<int>::const_iterator::operator++(&local_298);
        }
        pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
                 m_constModel;
        pQVar2 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
                 m_constModel;
        (**(code **)(*(long *)pQVar2 + 0x60))(local_3d0,pQVar2,local_1cc,local_1d0,local_f8);
        uVar9 = (**(code **)(*(long *)pQVar1 + 0x88))(pQVar1,local_3d0);
        pQVar3 = parent_local;
        if ((uVar9 & 1) != 0) {
          pQVar1 = (this->super_AbstractStringSerialiserPrivate).
                   super_AbstractModelSerialiserPrivate.m_constModel;
          (**(code **)(*(long *)pQVar1 + 0x60))(&local_3e8,pQVar1,local_1cc,local_1d0,local_f8);
          writeXmlElement(this,(QXmlStreamWriter *)pQVar3,&local_3e8);
        }
        QXmlStreamWriter::writeEndElement();
      }
    }
    QXmlStreamWriter::writeEndElement();
  }
  return;
}

Assistant:

void XmlModelSerialiserPrivate::writeXmlElement(QXmlStreamWriter &destination, const QModelIndex &parent) const
{
    Q_ASSERT(m_constModel);
    if (m_constModel->rowCount(parent) + m_constModel->columnCount(parent) == 0)
        return;
    destination.writeStartElement(QStringLiteral("Element"));
    destination.writeAttribute(QStringLiteral("RowCount"), QString::number(m_constModel->rowCount(parent)));
    destination.writeAttribute(QStringLiteral("ColumnCount"), QString::number(m_constModel->columnCount(parent)));
    for (int i = 0; i < m_constModel->rowCount(parent); ++i) {
        for (int j = 0; j < m_constModel->columnCount(parent); ++j) {
            destination.writeStartElement(QStringLiteral("Cell"));
            destination.writeStartElement(QStringLiteral("Row"));
            destination.writeCharacters(QString::number(i));
            destination.writeEndElement(); // Row
            destination.writeStartElement(QStringLiteral("Column"));
            destination.writeCharacters(QString::number(j));
            destination.writeEndElement(); // Column
            for (QList<int>::const_iterator singleRole = m_rolesToSave.constBegin(); singleRole != m_rolesToSave.constEnd(); ++singleRole) {
                const QVariant roleData = m_constModel->index(i, j, parent).data(*singleRole);
                if (roleData.isNull())
                    continue; // Skip empty roles
                const QString roleString = saveVariant(roleData);
                if (roleString.isEmpty())
                    continue; // Skip unhandled types
                destination.writeStartElement(QStringLiteral("DataPoint"));
                destination.writeAttribute(QStringLiteral("Role"), QString::number(*singleRole));
                destination.writeAttribute(QStringLiteral("Type"), QString::number(roleData.userType()));
                destination.writeCharacters(roleString);
                destination.writeEndElement(); // DataPoint
            }
            if (m_constModel->hasChildren(m_constModel->index(i, j, parent))) {
                writeXmlElement(destination, m_constModel->index(i, j, parent));
            }
            destination.writeEndElement(); // Cell
        }
    }
    destination.writeEndElement(); // Element
}